

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoder_get_data_format
                    (ma_decoder *pDecoder,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_result mVar1;
  
  if (pDecoder == (ma_decoder *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    if (pFormat != (ma_format *)0x0) {
      *pFormat = pDecoder->outputFormat;
    }
    if (pChannels != (ma_uint32 *)0x0) {
      *pChannels = pDecoder->outputChannels;
    }
    if (pSampleRate != (ma_uint32 *)0x0) {
      *pSampleRate = pDecoder->outputSampleRate;
    }
    mVar1 = MA_SUCCESS;
    if (pChannelMap != (ma_channel *)0x0) {
      ma_data_converter_get_output_channel_map(&pDecoder->converter,pChannelMap,channelMapCap);
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_get_data_format(ma_decoder* pDecoder, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFormat != NULL) {
        *pFormat = pDecoder->outputFormat;
    }

    if (pChannels != NULL) {
        *pChannels = pDecoder->outputChannels;
    }

    if (pSampleRate != NULL) {
        *pSampleRate = pDecoder->outputSampleRate;
    }

    if (pChannelMap != NULL) {
        ma_data_converter_get_output_channel_map(&pDecoder->converter, pChannelMap, channelMapCap);
    }

    return MA_SUCCESS;
}